

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

_tExecReaction __thiscall yactfr::internal::Vm::_execReadFlBitMapBeRev(Vm *this,Instr *instr)

{
  Instr *instr_local;
  Vm *this_local;
  
  _execReadFlBitMap<yactfr::internal::(anonymous_namespace)::readFlUIntBeFuncs,_true>(this,instr);
  return FetchNextInstrAndStop;
}

Assistant:

Vm::_tExecReaction Vm::_execReadFlBitMapBeRev(const Instr& instr)
{
    this->_execReadFlBitMap<readFlUIntBeFuncs, true>(instr);
    return _tExecReaction::FetchNextInstrAndStop;
}